

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::readNumericalWords(string *ustring,size_t *index)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  __tuple_element_t<0UL,_tuple<const_char_*,_double,_int>_> *ppcVar6;
  __tuple_element_t<1UL,_tuple<const_char_*,_double,_int>_> *p_Var7;
  __tuple_element_t<2UL,_tuple<const_char_*,_double,_int>_> *p_Var8;
  ulong uVar9;
  const_iterator pvVar10;
  char *pcVar11;
  double dVar12;
  string *__value;
  double toTen;
  value_type *wp_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<std::tuple<const_char_*,_double,_int>,_8UL> *__range1_1;
  string *local_110;
  double val_p2;
  double local_e8;
  double val_add;
  size_t index_sub;
  string local_d0;
  double local_b0;
  double val_p2_1;
  size_t index_sub_1;
  size_type loc;
  value_type *wp;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_double,_int>,_6UL> *__range1;
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  string lcstring;
  double val;
  size_t *index_local;
  string *ustring_local;
  
  lcstring.field_2._8_8_ = 0x7ff4000000000000;
  *index = 0;
  uVar5 = std::__cxx11::string::size();
  if (uVar5 < 3) {
    ustring_local = (string *)lcstring.field_2._8_8_;
  }
  else {
    bVar2 = hasValidNumericalWordStart(ustring);
    if (bVar2) {
      std::__cxx11::string::string((string *)local_48,(string *)ustring);
      local_50._M_current = (char *)std::__cxx11::string::begin();
      local_58._M_current = (char *)std::__cxx11::string::end();
      local_60 = (char *)std::__cxx11::string::begin();
      __range1 = (array<std::tuple<const_char_*,_double,_int>,_6UL> *)
                 std::
                 transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                           (local_50,local_58,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_60,tolower);
      __begin1 = (const_iterator)groupNumericalWords;
      __end1 = std::array<std::tuple<const_char_*,_double,_int>,_6UL>::begin
                         ((array<std::tuple<const_char_*,_double,_int>,_6UL> *)groupNumericalWords);
      wp = std::array<std::tuple<const_char_*,_double,_int>,_6UL>::end
                     ((array<std::tuple<const_char_*,_double,_int>,_6UL> *)groupNumericalWords);
      for (; __end1 != wp; __end1 = __end1 + 1) {
        loc = (size_type)__end1;
        ppcVar6 = std::get<0ul,char_const*,double,int>(__end1);
        index_sub_1 = std::__cxx11::string::find(local_48,(ulong)*ppcVar6);
        if (index_sub_1 != 0xffffffffffffffff) {
          if (index_sub_1 == 0) {
            val_p2_1 = 0.0;
            p_Var7 = std::get<1ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)loc);
            lcstring.field_2._8_8_ = *p_Var7;
            p_Var8 = std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)loc);
            *index = (long)*p_Var8;
            uVar5 = *index;
            uVar9 = std::__cxx11::string::size();
            if (uVar5 < uVar9) {
              std::__cxx11::string::substr((ulong)&local_d0,(ulong)local_48);
              dVar12 = readNumericalWords(&local_d0,(size_t *)&val_p2_1);
              std::__cxx11::string::~string((string *)&local_d0);
              local_b0 = dVar12;
              uVar3 = std::isnan(dVar12);
              if ((uVar3 & 1) == 0) {
                if (local_b0 < (double)lcstring.field_2._8_8_) {
                  lcstring.field_2._8_8_ = (size_type)(local_b0 + lcstring.field_2._8_8_);
                }
                else {
                  lcstring.field_2._8_8_ = (size_type)(lcstring.field_2._8_8_ * local_b0);
                }
                *index = (long)val_p2_1 + *index;
              }
            }
            ustring_local = (string *)lcstring.field_2._8_8_;
          }
          else {
            val_add = 0.0;
            p_Var7 = std::get<1ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)loc);
            sVar1 = index_sub_1;
            lcstring.field_2._8_8_ = *p_Var7;
            p_Var8 = std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)loc);
            *index = sVar1 + (long)*p_Var8;
            local_e8 = 0.0;
            uVar5 = *index;
            uVar9 = std::__cxx11::string::size();
            if (uVar5 < uVar9) {
              std::__cxx11::string::substr((ulong)&val_p2,(ulong)local_48);
              local_e8 = readNumericalWords((string *)&val_p2,(size_t *)&val_add);
              std::__cxx11::string::~string((string *)&val_p2);
              uVar3 = std::isnan(local_e8);
              if ((uVar3 & 1) == 0) {
                if ((double)lcstring.field_2._8_8_ <= local_e8) {
                  lcstring.field_2._8_8_ = (size_type)(lcstring.field_2._8_8_ * local_e8);
                  local_e8 = 0.0;
                }
                *index = (long)val_add + *index;
              }
              else {
                local_e8 = 0.0;
              }
            }
            std::__cxx11::string::substr((ulong)&__range1_1,(ulong)local_48);
            __value = (string *)readNumericalWords((string *)&__range1_1,(size_t *)&val_add);
            std::__cxx11::string::~string((string *)&__range1_1);
            local_110 = __value;
            uVar3 = std::isnan((double)__value);
            if (((uVar3 & 1) == 0) && (index_sub_1 <= (ulong)val_add)) {
              lcstring.field_2._8_8_ = local_e8 + (double)local_110 * (double)lcstring.field_2._8_8_
              ;
              ustring_local = (string *)lcstring.field_2._8_8_;
            }
            else {
              *index = (size_t)val_add;
              ustring_local = local_110;
            }
          }
          goto LAB_001afc86;
        }
      }
      iVar4 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x3);
      if (iVar4 == 0) {
        *index = *index + 3;
      }
      __end1_1 = std::array<std::tuple<const_char_*,_double,_int>,_8UL>::begin
                           ((array<std::tuple<const_char_*,_double,_int>,_8UL> *)decadeWords);
      pvVar10 = std::array<std::tuple<const_char_*,_double,_int>,_8UL>::end
                          ((array<std::tuple<const_char_*,_double,_int>,_8UL> *)decadeWords);
      for (; __end1_1 != pvVar10; __end1_1 = __end1_1 + 1) {
        uVar5 = *index;
        p_Var8 = std::get<2ul,char_const*,double,int>(__end1_1);
        iVar4 = *p_Var8;
        std::get<0ul,char_const*,double,int>(__end1_1);
        iVar4 = std::__cxx11::string::compare((ulong)local_48,uVar5,(char *)(long)iVar4);
        if (iVar4 == 0) {
          p_Var7 = std::get<1ul,char_const*,double,int>(__end1_1);
          lcstring.field_2._8_8_ = *p_Var7;
          p_Var8 = std::get<2ul,char_const*,double,int>(__end1_1);
          *index = (long)*p_Var8 + *index;
          uVar5 = std::__cxx11::string::size();
          if (*index < uVar5) {
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
            if (*pcVar11 == '-') {
              *index = *index + 1;
            }
            dVar12 = read1To10((string *)local_48,index);
            uVar3 = std::isnan(dVar12);
            if ((uVar3 & 1) == 0) {
              lcstring.field_2._8_8_ = (size_type)(dVar12 + lcstring.field_2._8_8_);
            }
          }
          ustring_local = (string *)lcstring.field_2._8_8_;
          goto LAB_001afc86;
        }
      }
      lcstring.field_2._8_8_ = readTeens((string *)local_48,index);
      uVar3 = std::isnan((double)lcstring.field_2._8_8_);
      if ((uVar3 & 1) == 0) {
        ustring_local = (string *)lcstring.field_2._8_8_;
      }
      else {
        lcstring.field_2._8_8_ = read1To10((string *)local_48,index);
        ustring_local = (string *)lcstring.field_2._8_8_;
      }
LAB_001afc86:
      index_sub._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      ustring_local = (string *)lcstring.field_2._8_8_;
    }
  }
  return (double)ustring_local;
}

Assistant:

static double readNumericalWords(const std::string& ustring, size_t& index)
{
    double val = constants::invalid_conversion;
    index = 0;
    if (ustring.size() < 3) {
        return val;
    }
    if (!hasValidNumericalWordStart(ustring)) {
        return val;
    }
    std::string lcstring{ustring};
    // make the string lower case for consistency
    std::transform(
        lcstring.begin(), lcstring.end(), lcstring.begin(), ::tolower);
    for (const auto& wp : groupNumericalWords) {
        auto loc = lcstring.find(std::get<0>(wp));
        if (loc != std::string::npos) {
            if (loc == 0) {
                size_t index_sub{0};
                val = std::get<1>(wp);
                index = std::get<2>(wp);
                if (index < lcstring.size()) {
                    double val_p2 =
                        readNumericalWords(lcstring.substr(index), index_sub);
                    if (!std::isnan(val_p2)) {
                        if (val_p2 >= val) {
                            val = val * val_p2;
                        } else {
                            val += val_p2;
                        }

                        index += index_sub;
                    }
                }
                return val;
            }
            size_t index_sub{0};
            val = std::get<1>(wp);
            index = loc + std::get<2>(wp);
            // read the next component
            double val_add{0.0};
            if (index < lcstring.size()) {
                val_add = readNumericalWords(lcstring.substr(index), index_sub);
                if (!std::isnan(val_add)) {
                    if (val_add >= val) {
                        val = val * val_add;
                        val_add = 0.0;
                    }
                    index += index_sub;
                } else {
                    val_add = 0.0;
                }
            }
            // read the previous part
            double val_p2 =
                readNumericalWords(lcstring.substr(0, loc), index_sub);
            if (std::isnan(val_p2) || index_sub < loc) {
                index = index_sub;
                return val_p2;
            }
            val *= val_p2;
            val += val_add;
            return val;
        }
    }
    // clean up "and"
    if (lcstring.compare(0, 3, "and") == 0) {
        index += 3;
    }
    // what we are left with is values below a hundred
    for (const auto& wp : decadeWords) {
        if (lcstring.compare(index, std::get<2>(wp), std::get<0>(wp)) == 0) {
            val = std::get<1>(wp);
            index += std::get<2>(wp);
            if (lcstring.size() > index) {
                if (lcstring[index] == '-') {
                    ++index;
                }
                double toTen = read1To10(lcstring, index);
                if (!std::isnan(toTen)) {
                    val += toTen;
                }
            }
            return val;
        }
    }
    val = readTeens(lcstring, index);
    if (!std::isnan(val)) {
        return val;
    }
    val = read1To10(lcstring, index);
    return val;
}